

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraphFlattener::convertMultiLevelInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node)

{
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *this_00;
  Node *pNVar1;
  Ref<embree::SceneGraph::Node> *pRVar2;
  Node *in_RAX;
  long *plVar3;
  iterator iVar4;
  TransformNode *this_01;
  mapped_type *pmVar5;
  MultiTransformNode *this_02;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar1 = node->ptr;
  local_38.ptr = in_RAX;
  if (pNVar1 != (Node *)0x0) {
    plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::GroupNode::typeinfo,0);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      pRVar2 = (Ref<embree::SceneGraph::Node> *)plVar3[0xe];
      for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar3[0xd]; node_00 != pRVar2;
          node_00 = node_00 + 1) {
        convertMultiLevelInstances(this,group,node_00);
      }
      (**(code **)(*plVar3 + 0x18))(plVar3);
      return;
    }
    plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::TriangleMeshNode::typeinfo,0);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      (**(code **)(*plVar3 + 0x18))(plVar3);
      goto LAB_0014cd9f;
    }
    plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::QuadMeshNode::typeinfo,0);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      (**(code **)(*plVar3 + 0x18))(plVar3);
      goto LAB_0014cd9f;
    }
    plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::GridMeshNode::typeinfo,0);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      (**(code **)(*plVar3 + 0x18))(plVar3);
      goto LAB_0014cd9f;
    }
    plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::SubdivMeshNode::typeinfo,0);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      (**(code **)(*plVar3 + 0x18))(plVar3);
      goto LAB_0014cd9f;
    }
    plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::HairSetNode::typeinfo,0);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      (**(code **)(*plVar3 + 0x18))(plVar3);
      goto LAB_0014cd9f;
    }
    plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::PointSetNode::typeinfo,0);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      (**(code **)(*plVar3 + 0x18))(plVar3);
      goto LAB_0014cd9f;
    }
  }
  this_00 = &this->object_mapping;
  iVar4 = std::
          _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
          ::find(&this_00->_M_t,node);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->object_mapping)._M_t._M_impl.super__Rb_tree_header
     ) {
    pNVar1 = node->ptr;
    if (pNVar1 != (Node *)0x0) {
      plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                      &SceneGraph::TransformNode::typeinfo,0);
      if (plVar3 == (long *)0x0) {
        plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::MultiTransformNode::typeinfo,0);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x10))(plVar3);
          this_02 = (MultiTransformNode *)SceneGraph::MultiTransformNode::operator_new(0x88);
          convertMultiLevelInstances((SceneGraphFlattener *)&stack0xffffffffffffffc8,&this->node);
          SceneGraph::MultiTransformNode::MultiTransformNode
                    (this_02,(vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                              *)(plVar3 + 0xd),&stack0xffffffffffffffc8);
          if (local_38.ptr != (Node *)0x0) {
            (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
          }
          pmVar5 = std::
                   map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[](this_00,node);
          (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
          if (pmVar5->ptr != (Node *)0x0) {
            (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pmVar5->ptr = (Node *)this_02;
          local_38.ptr = (Node *)this_02;
          (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
          ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                    ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                      *)group,&stack0xffffffffffffffc8);
          if ((MultiTransformNode *)local_38.ptr != (MultiTransformNode *)0x0) {
            (*(((Node *)&(local_38.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
          }
          (**(code **)(*plVar3 + 0x18))(plVar3);
        }
      }
      else {
        (**(code **)(*plVar3 + 0x10))(plVar3);
        this_01 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
        convertMultiLevelInstances((SceneGraphFlattener *)&stack0xffffffffffffffc8,&this->node);
        SceneGraph::TransformNode::TransformNode
                  (this_01,(Transformations *)(plVar3 + 0xd),&stack0xffffffffffffffc8);
        if (local_38.ptr != (Node *)0x0) {
          (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        pmVar5 = std::
                 map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[](this_00,node);
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
        if (pmVar5->ptr != (Node *)0x0) {
          (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        pmVar5->ptr = (Node *)this_01;
        local_38.ptr = (Node *)this_01;
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    *)group,&stack0xffffffffffffffc8);
        if ((TransformNode *)local_38.ptr != (TransformNode *)0x0) {
          (*(((Node *)&(local_38.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar3 + 0x18))(plVar3);
      }
    }
    return;
  }
  node = std::
         map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
         ::operator[](this_00,node);
LAB_0014cd9f:
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::push_back(group,node);
  return;
}

Assistant:

void convertMultiLevelInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node)
    {
      if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertMultiLevelInstances(group,child);
      }
      else if (node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::QuadMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::GridMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::HairSetNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::PointSetNode>()) {
        group.push_back(node);
      }
      else if (object_mapping.find(node) != object_mapping.end()) {
        group.push_back(object_mapping[node]);
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>())
      {
        auto new_node = new SceneGraph::TransformNode(xfmNode->spaces,convertMultiLevelInstances(xfmNode->child));
        object_mapping[node] = new_node;
        group.push_back(new_node);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>())
      {
        auto new_node = new SceneGraph::MultiTransformNode(xfmNode->spaces,convertMultiLevelInstances(xfmNode->child));
        object_mapping[node] = new_node;
        group.push_back(new_node);
      }
    }